

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O0

String * __thiscall chatra::Reference::allocateWithoutLock<chatra::String>(Reference *this)

{
  String *this_00;
  String *object;
  Reference *this_local;
  
  this_00 = (String *)operator_new(0xf8);
  String::String(this_00,this->node->group->storage);
  ReferenceNode::setObject(this->node,(Object *)this_00);
  Storage::registerObject(this->node->group->storage,this->node->object);
  return this_00;
}

Assistant:

Type& Reference::allocateWithoutLock(Args&&... args) const {
	chatra_assert(node != nullptr);
	Type* object = new Type(node->group.storage, std::forward<Args>(args)...);
	node->setObject(object);
	node->group.storage.registerObject(node->object);
	return *object;
}